

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::js::api::json::ConvertEntropyToMnemonicResponse::ConvertEntropyToMnemonicResponse
          (ConvertEntropyToMnemonicResponse *this)

{
  ConvertEntropyToMnemonicResponse *this_local;
  
  core::JsonClassBase<cfd::js::api::json::ConvertEntropyToMnemonicResponse>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::ConvertEntropyToMnemonicResponse>);
  (this->super_JsonClassBase<cfd::js::api::json::ConvertEntropyToMnemonicResponse>).
  _vptr_JsonClassBase = (_func_int **)&PTR__ConvertEntropyToMnemonicResponse_01b3b558;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::JsonValueVector(&this->mnemonic_);
  CollectFieldName();
  return;
}

Assistant:

ConvertEntropyToMnemonicResponse() {
    CollectFieldName();
  }